

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O1

Script * cfd::core::ScriptUtil::CreateP2wpkhLockingScript
                   (Script *__return_storage_ptr__,ByteData160 *pubkey_hash)

{
  ScriptBuilder builder;
  ScriptBuilder local_38;
  
  local_38._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_00733958;
  local_38.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ScriptBuilder::AppendOperator(&local_38,(ScriptOperator *)ScriptOperator::OP_0);
  ScriptBuilder::AppendData(&local_38,pubkey_hash);
  ScriptBuilder::Build(__return_storage_ptr__,&local_38);
  local_38._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_00733958;
  if (local_38.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.script_byte_array_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Script ScriptUtil::CreateP2wpkhLockingScript(const ByteData160& pubkey_hash) {
  // create script
  ScriptBuilder builder;
  builder.AppendOperator(ScriptOperator::OP_0);
  builder.AppendData(pubkey_hash);

  return builder.Build();
}